

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_c3bcac::HandleHashCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer this_00;
  cmMakefile *this_01;
  string_view sVar4;
  undefined1 local_88 [8];
  string out;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> local_58;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar2 == 3) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    out.field_2._8_8_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3);
    sVar4._M_str = (char *)out.field_2._8_8_;
    sVar4._M_len = (size_t)&local_58;
    cmCryptoHash::New(sVar4);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
    if (bVar1) {
      this_00 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::operator->
                          (&local_58);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      sVar4 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3);
      cmCryptoHash::HashString_abi_cxx11_((string *)local_88,this_00,sVar4);
      this_01 = cmExecutionStatus::GetMakefile(local_20);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      sVar4 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
      cmMakefile::AddDefinition(this_01,pvVar3,sVar4);
      args_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_88);
    }
    else {
      args_local._7_1_ = 0;
    }
    std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr(&local_58);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[49]>
              (&local_40,pvVar3,(char (*) [49])" requires an output variable and an input string");
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleHashCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires an output variable and an input string"));
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0]));
  if (hash) {
    std::string out = hash->HashString(args[2]);
    status.GetMakefile().AddDefinition(args[1], out);
    return true;
  }
  return false;
}